

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O3

int xmlTextWriterWriteCDATA(xmlTextWriterPtr writer,xmlChar *content)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = xmlTextWriterStartCDATA(writer);
  iVar3 = -1;
  if (iVar1 != -1) {
    if (content != (xmlChar *)0x0) {
      iVar2 = xmlTextWriterWriteString(writer,content);
      if (iVar2 == -1) {
        return -1;
      }
      iVar1 = iVar1 + iVar2;
    }
    iVar2 = xmlTextWriterEndCDATA(writer);
    if (iVar2 != -1) {
      iVar3 = iVar2 + iVar1;
    }
  }
  return iVar3;
}

Assistant:

int
xmlTextWriterWriteCDATA(xmlTextWriterPtr writer, const xmlChar * content)
{
    int count;
    int sum;

    sum = 0;
    count = xmlTextWriterStartCDATA(writer);
    if (count == -1)
        return -1;
    sum += count;
    if (content != 0) {
        count = xmlTextWriterWriteString(writer, content);
        if (count == -1)
            return -1;
        sum += count;
    }
    count = xmlTextWriterEndCDATA(writer);
    if (count == -1)
        return -1;
    sum += count;

    return sum;
}